

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

void __thiscall HawkTracer::parser::Event::Value::Value(Value *this,Value *other)

{
  FieldType FVar1;
  
  this->field = (EventKlassField *)0x0;
  this->field = other->field;
  other->field = (EventKlassField *)0x0;
  FVar1 = this->value;
  this->value = other->value;
  other->value = FVar1;
  return;
}

Assistant:

Event::Value::Value(Value&& other) :
    Value()
{
    _swap(other);
}